

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

void __thiscall Clasp::Cli::LemmaLogger::startStep(LemmaLogger *this,ProgramBuilder *prg,bool inc)

{
  bool bVar1;
  size_type sVar2;
  Atom_t AVar3;
  size_type sVar4;
  uint uVar5;
  Var VVar6;
  size_type sVar7;
  __int_type *p_Var8;
  pred_iterator pPVar9;
  pred_iterator pPVar10;
  reference puVar11;
  size_t *siglen;
  byte in_DL;
  char *pcVar12;
  uchar *sig;
  uchar *extraout_RDX;
  uchar *sig_00;
  LogicProgram *in_RSI;
  EVP_PKEY_CTX *ctx_00;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  Var v;
  pred_iterator end;
  pred_iterator it;
  pred_iterator beg;
  SharedContext *ctx;
  Lit_t *p;
  Literal sLit;
  Atom_t a;
  LogicProgram *asp;
  SharedContext *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  __int_type in_stack_ffffffffffffff64;
  __atomic_base<unsigned_int> *in_stack_ffffffffffffff68;
  size_type *this_00;
  undefined4 in_stack_ffffffffffffff80;
  Atom_t in_stack_ffffffffffffff84;
  Atom_t AVar13;
  Atom_t in_stack_ffffffffffffff8c;
  pred_iterator local_50;
  MapLit_t in_stack_ffffffffffffffd4;
  Literal in_stack_ffffffffffffffd8;
  LogicProgram *pLVar14;
  
  std::__atomic_base<unsigned_int>::operator=(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  in_RDI[3].ebo_.size = in_RDI[3].ebo_.size + 1;
  if (((ulong)in_RDI[3].ebo_.buf & 0x10000000000) == 0) {
    if (in_RDI[3].ebo_.size == 1) {
      pcVar12 = "";
      if ((in_DL & 1) != 0) {
        pcVar12 = " incremental";
      }
      fprintf((FILE *)(in_RDI->ebo_).buf,"asp 1 0 0%s\n",pcVar12);
    }
    else {
      fprintf((FILE *)(in_RDI->ebo_).buf,"0\n");
    }
  }
  sVar2 = ProgramBuilder::type((ProgramBuilder *)0x119362);
  in_RDI[2].ebo_.size = sVar2;
  if ((sVar2 == 2) &&
     (bVar1 = ProgramBuilder::endProgram
                        ((ProgramBuilder *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)), bVar1)) {
    pLVar14 = in_RSI;
    in_stack_ffffffffffffff8c = Asp::LogicProgram::startAtom(in_RSI);
    while (AVar13 = in_stack_ffffffffffffff8c,
          AVar3 = Asp::LogicProgram::startAuxAtom
                            ((LogicProgram *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
          in_stack_ffffffffffffff8c != AVar3) {
      AVar3 = AVar13;
      Asp::MapLit_t::MapLit_t((MapLit_t *)&stack0xffffffffffffffd4,Raw);
      in_stack_ffffffffffffffd8 =
           Asp::LogicProgram::getLiteral
                     ((LogicProgram *)CONCAT44(AVar3,in_stack_ffffffffffffffd8.rep_),
                      in_stack_ffffffffffffffd4.val_,(MapLit_t)(E)pLVar14);
      VVar6 = Literal::var((Literal *)&stack0xffffffffffffffd8);
      sVar4 = bk_lib::pod_vector<int,_std::allocator<int>_>::size
                        ((pod_vector<int,_std::allocator<int>_> *)&(in_RDI->ebo_).size);
      siglen = (size_t *)(ulong)sVar4;
      in_stack_ffffffffffffff84 = AVar13;
      if (sVar4 <= VVar6) {
        Literal::var((Literal *)&stack0xffffffffffffffd8);
        bk_lib::pod_vector<int,_std::allocator<int>_>::resize
                  ((pod_vector<int,_std::allocator<int>_> *)in_RDI,in_stack_ffffffffffffff8c,
                   (int *)CONCAT44(AVar13,in_stack_ffffffffffffff80));
        in_stack_ffffffffffffff84 = AVar13;
      }
      this_00 = &(in_RDI->ebo_).size;
      VVar6 = Literal::var((Literal *)&stack0xffffffffffffffd8);
      ctx_00 = (EVP_PKEY_CTX *)(ulong)VVar6;
      p_Var8 = (__int_type *)
               bk_lib::pod_vector<int,_std::allocator<int>_>::operator[]
                         ((pod_vector<int,_std::allocator<int>_> *)this_00,VVar6);
      sig_00 = sig;
      if ((*p_Var8 == 0) ||
         ((uVar5 = Literal::sign((Literal *)&stack0xffffffffffffffd8,ctx_00,sig,siglen,in_R8,in_R9),
          (uVar5 & 1) == 0 && (sig_00 = extraout_RDX, (int)*p_Var8 < 0)))) {
        uVar5 = Literal::sign((Literal *)&stack0xffffffffffffffd8,ctx_00,sig_00,siglen,in_R8,in_R9);
        if ((uVar5 & 1) == 0) {
          in_stack_ffffffffffffff64 = Potassco::lit(AVar3);
        }
        else {
          in_stack_ffffffffffffff64 = Potassco::neg(0);
        }
        *p_Var8 = in_stack_ffffffffffffff64;
      }
      in_stack_ffffffffffffff8c = AVar3 + 1;
    }
  }
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&in_RDI[1].ebo_.size);
  if ((((ulong)in_RDI[3].ebo_.buf & 0x10000000000) != 0) &&
     (bVar1 = ProgramBuilder::endProgram
                        ((ProgramBuilder *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)), bVar1)) {
    ProgramBuilder::ctx(&in_RSI->super_ProgramBuilder);
    pPVar9 = OutputTable::pred_begin((OutputTable *)0x11956c);
    pPVar10 = OutputTable::pred_end((OutputTable *)0x119589);
    for (local_50 = pPVar9; local_50 != pPVar10; local_50 = local_50 + 1) {
      VVar6 = Literal::var(&local_50->cond);
      SharedContext::varInfo(in_stack_ffffffffffffff58,0);
      bVar1 = VarInfo::output((VarInfo *)0x1195cc);
      if (bVar1) {
        sVar7 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &in_RDI[1].ebo_.size);
        if (sVar7 <= VVar6) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (in_RDI,in_stack_ffffffffffffff8c,
                     (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        }
        uVar5 = (uint)((long)local_50 - (long)pPVar9 >> 4);
        puVar11 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &in_RDI[1].ebo_.size,VVar6);
        *puVar11 = uVar5;
      }
    }
  }
  return;
}

Assistant:

void LemmaLogger::startStep(ProgramBuilder& prg, bool inc) {
	logged_ = 0;
	++step_;
	if (!options_.logText) {
		if (step_ == 1) { fprintf(str_, "asp 1 0 0%s\n", inc ? " incremental" : ""); }
		else            { fprintf(str_, "0\n"); }
	}
	if ((inputType_ = static_cast<Problem_t::Type>(prg.type())) == Problem_t::Asp && prg.endProgram()) {
		// create solver variable to potassco literal mapping
		Asp::LogicProgram& asp = static_cast<Asp::LogicProgram&>(prg);
		for (Asp::Atom_t a = asp.startAtom(); a != asp.startAuxAtom(); ++a) {
			Literal sLit = asp.getLiteral(a);
			if (sLit.var() >= solver2asp_.size()) {
				solver2asp_.resize(sLit.var() + 1, 0);
			}
			Potassco::Lit_t& p = solver2asp_[sLit.var()];
			if (!p || (!sLit.sign() && p < 0)) {
				p = !sLit.sign() ? Potassco::lit(a) : Potassco::neg(a);
			}
		}
	}
	solver2NameIdx_.clear();
	if (options_.logText && prg.endProgram()) {
		const SharedContext& ctx = *prg.ctx();
		for (OutputTable::pred_iterator beg = ctx.output.pred_begin(), it = beg, end = ctx.output.pred_end(); it != end; ++it) {
			Var v = it->cond.var();
			if (ctx.varInfo(v).output()) {
				if (solver2NameIdx_.size() <= v) { solver2NameIdx_.resize(v + 1, UINT32_MAX); }
				solver2NameIdx_[v] = static_cast<uint32>(it - beg);
			}
		}
	}
}